

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compiler.cpp
# Opt level: O3

void __thiscall
cs::compiler_type::import_csym(compiler_type *this,string *module_path,string *csym_path)

{
  _Alloc_hider __nptr;
  _Alloc_hider _Var1;
  char cVar2;
  bool bVar3;
  int iVar4;
  int *piVar5;
  ulonglong uVar6;
  undefined8 uVar7;
  size_type sVar8;
  string buff;
  string map_str;
  csym_info csym;
  string header;
  smatch match;
  regex reg;
  ifstream ifs;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_358;
  unsigned_long local_338;
  string_type local_330;
  undefined1 local_310 [56];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  vStack_2d8;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_2c0;
  long local_2b8;
  char local_2b0;
  undefined7 uStack_2af;
  pair<phmap::priv::raw_hash_set<phmap::priv::FlatHashMapPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cs::csym_info>,_phmap::Hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_phmap::EqualTo<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cs::csym_info>_>_>::iterator,_bool>
  local_2a0;
  compiler_type *local_288;
  string *local_280;
  match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  local_278;
  basic_regex<char,_std::__cxx11::regex_traits<char>_> local_258;
  long local_238 [4];
  byte abStack_218 [488];
  
  std::ifstream::ifstream(local_238,(string *)csym_path,_S_in);
  cVar2 = std::__basic_file<char>::is_open();
  if (cVar2 == '\0') goto LAB_0028b2bc;
  local_310._0_8_ = local_310 + 0x10;
  local_310._8_8_ = 0;
  local_310[0x10] = '\0';
  local_310._32_8_ = (pointer)0x0;
  local_310._40_8_ = (unsigned_long *)0x0;
  local_310._48_8_ = (unsigned_long *)0x0;
  vStack_2d8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  vStack_2d8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  vStack_2d8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::basic_regex
            (&local_258,"^#\\$cSYM/1\\.0\\(([^\\)]*)\\):(.*)$",0x10);
  local_2c0._M_current = &local_2b0;
  local_2b8 = 0;
  local_2b0 = '\0';
  local_358._M_dataplus._M_p = (pointer)&local_358.field_2;
  local_358._M_string_length = 0;
  local_358.field_2._M_local_buf[0] = '\0';
  local_288 = this;
  local_280 = module_path;
  iVar4 = std::istream::get();
  bVar3 = false;
  while ((abStack_218[*(long *)(local_238[0] + -0x18)] & 5) == 0) {
    cVar2 = (char)&local_358;
    if (bVar3) {
      if (iVar4 != 10) {
        std::__cxx11::string::push_back(cVar2);
        goto LAB_0028ae51;
      }
LAB_0028ae5d:
      if (local_2b8 == 0) {
        std::__cxx11::string::swap((string *)&local_2c0);
      }
      else {
        std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        emplace_back<std::__cxx11::string&>
                  ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&vStack_2d8,
                   &local_358);
        local_358._M_string_length = 0;
        *local_358._M_dataplus._M_p = '\0';
      }
LAB_0028aea3:
      bVar3 = false;
    }
    else {
LAB_0028ae51:
      if (iVar4 != 0xd) {
        if (iVar4 == 10) goto LAB_0028ae5d;
        std::__cxx11::string::push_back(cVar2);
        goto LAB_0028aea3;
      }
      bVar3 = true;
    }
    iVar4 = std::istream::get();
  }
  if (local_358._M_string_length != 0) {
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string&>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&vStack_2d8,
               &local_358);
  }
  local_278.
  super_vector<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  .
  super__Vector_base<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_278._M_begin._M_current = (char *)0x0;
  local_278.
  super_vector<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  .
  super__Vector_base<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_278.
  super_vector<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  .
  super__Vector_base<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  bVar3 = std::__detail::
          __regex_algo_impl<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>>,char,std::__cxx11::regex_traits<char>,(std::__detail::_RegexExecutorPolicy)0,true>
                    (local_2c0,
                     (__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      )(local_2c0._M_current + local_2b8),&local_278,&local_258,0);
  if (bVar3) {
    std::__cxx11::
    match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
    ::str(&local_330,&local_278,1);
    std::__cxx11::string::operator=((string *)local_310,(string *)&local_330);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_330._M_dataplus._M_p != &local_330.field_2) {
      operator_delete(local_330._M_dataplus._M_p,local_330.field_2._M_allocated_capacity + 1);
    }
    std::__cxx11::
    match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
    ::str(&local_330,&local_278,2);
    _Var1._M_p = local_330._M_dataplus._M_p;
    if (local_330._M_string_length != 0) {
      sVar8 = 0;
      do {
        if (_Var1._M_p[sVar8] == ',') {
          if (local_358._M_string_length != 0) {
            iVar4 = std::__cxx11::string::compare((char *)&local_358);
            __nptr._M_p = local_358._M_dataplus._M_p;
            if (iVar4 == 0) {
              local_2a0.first.ctrl_ = (pointer)0x0;
              if (local_310._40_8_ == local_310._48_8_) {
                std::vector<unsigned_long,_std::allocator<unsigned_long>_>::
                _M_realloc_insert<unsigned_long>
                          ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                           (local_310 + 0x20),(iterator)local_310._40_8_,(unsigned_long *)&local_2a0
                          );
              }
              else {
                *(unsigned_long *)local_310._40_8_ = 0;
                local_310._40_8_ = local_310._40_8_ + 8;
              }
            }
            else {
              piVar5 = __errno_location();
              iVar4 = *piVar5;
              *piVar5 = 0;
              uVar6 = strtoull(__nptr._M_p,(char **)&local_2a0,10);
              if (local_2a0.first.ctrl_ == __nptr._M_p) {
                std::__throw_invalid_argument("stoull");
LAB_0028b2e7:
                std::__throw_out_of_range("stoull");
                goto LAB_0028b2f3;
              }
              if (*piVar5 == 0) {
                *piVar5 = iVar4;
              }
              else if (*piVar5 == 0x22) goto LAB_0028b2e7;
              local_338 = uVar6 + 1;
              if (local_310._40_8_ == local_310._48_8_) {
                std::vector<unsigned_long,_std::allocator<unsigned_long>_>::
                _M_realloc_insert<unsigned_long>
                          ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                           (local_310 + 0x20),(iterator)local_310._40_8_,&local_338);
              }
              else {
                *(unsigned_long *)local_310._40_8_ = local_338;
                local_310._40_8_ = local_310._40_8_ + 8;
              }
            }
            local_358._M_string_length = 0;
            *local_358._M_dataplus._M_p = '\0';
          }
        }
        else {
          std::__cxx11::string::push_back((char)&local_358);
        }
        sVar8 = sVar8 + 1;
      } while (local_330._M_string_length != sVar8);
    }
    if (local_358._M_string_length != 0) {
      iVar4 = std::__cxx11::string::compare((char *)&local_358);
      _Var1._M_p = local_358._M_dataplus._M_p;
      if (iVar4 == 0) {
LAB_0028b140:
        local_2a0.first.ctrl_ = (pointer)0x0;
        if (local_310._40_8_ != local_310._48_8_) {
          *(unsigned_long *)local_310._40_8_ = 0;
          goto LAB_0028b18f;
        }
        std::vector<unsigned_long,_std::allocator<unsigned_long>_>::_M_realloc_insert<unsigned_long>
                  ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)(local_310 + 0x20),
                   (iterator)local_310._40_8_,(unsigned_long *)&local_2a0);
      }
      else {
        piVar5 = __errno_location();
        iVar4 = *piVar5;
        *piVar5 = 0;
        uVar6 = strtoull(_Var1._M_p,(char **)&local_2a0,10);
        if (local_2a0.first.ctrl_ == _Var1._M_p) {
LAB_0028b2f3:
          uVar7 = std::__throw_invalid_argument("stoull");
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_330._M_dataplus._M_p != &local_330.field_2) {
            operator_delete(local_330._M_dataplus._M_p,local_330.field_2._M_allocated_capacity + 1);
          }
          if (local_278.
              super_vector<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
              .
              super__Vector_base<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
            operator_delete(local_278.
                            super_vector<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                            .
                            super__Vector_base<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start,
                            (long)local_278.
                                  super_vector<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                                  .
                                  super__Vector_base<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                                  ._M_impl.super__Vector_impl_data._M_end_of_storage -
                            (long)local_278.
                                  super_vector<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                                  .
                                  super__Vector_base<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_358._M_dataplus._M_p != &local_358.field_2) {
            operator_delete(local_358._M_dataplus._M_p,
                            CONCAT71(local_358.field_2._M_allocated_capacity._1_7_,
                                     local_358.field_2._M_local_buf[0]) + 1);
          }
          if (local_2c0._M_current != &local_2b0) {
            operator_delete(local_2c0._M_current,CONCAT71(uStack_2af,local_2b0) + 1);
          }
          std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::~basic_regex
                    (&local_258);
          csym_info::~csym_info((csym_info *)local_310);
          std::ifstream::~ifstream(local_238);
          _Unwind_Resume(uVar7);
        }
        if (*piVar5 == 0) {
          *piVar5 = iVar4;
        }
        else if (*piVar5 == 0x22) {
          std::__throw_out_of_range("stoull");
          goto LAB_0028b140;
        }
        local_338 = uVar6 + 1;
        if (local_310._40_8_ == local_310._48_8_) {
          std::vector<unsigned_long,_std::allocator<unsigned_long>_>::
          _M_realloc_insert<unsigned_long>
                    ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)(local_310 + 0x20),
                     (iterator)local_310._40_8_,&local_338);
        }
        else {
          *(unsigned_long *)local_310._40_8_ = local_338;
LAB_0028b18f:
          local_310._40_8_ = local_310._40_8_ + 8;
        }
      }
      local_358._M_string_length = 0;
      *local_358._M_dataplus._M_p = '\0';
    }
    phmap::priv::
    raw_hash_set<phmap::priv::FlatHashMapPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cs::csym_info>,_phmap::Hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_phmap::EqualTo<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cs::csym_info>_>_>
    ::
    emplace<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_cs::csym_info,_0>
              (&local_2a0,
               (raw_hash_set<phmap::priv::FlatHashMapPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cs::csym_info>,_phmap::Hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_phmap::EqualTo<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cs::csym_info>_>_>
                *)&local_288->csyms,local_280,(csym_info *)local_310);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_330._M_dataplus._M_p != &local_330.field_2) {
      operator_delete(local_330._M_dataplus._M_p,local_330.field_2._M_allocated_capacity + 1);
    }
  }
  if (local_278.
      super_vector<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
      .
      super__Vector_base<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_278.
                    super_vector<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                    .
                    super__Vector_base<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_278.
                          super_vector<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                          .
                          super__Vector_base<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_278.
                          super_vector<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                          .
                          super__Vector_base<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_358._M_dataplus._M_p != &local_358.field_2) {
    operator_delete(local_358._M_dataplus._M_p,
                    CONCAT71(local_358.field_2._M_allocated_capacity._1_7_,
                             local_358.field_2._M_local_buf[0]) + 1);
  }
  if (local_2c0._M_current != &local_2b0) {
    operator_delete(local_2c0._M_current,CONCAT71(uStack_2af,local_2b0) + 1);
  }
  std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::~basic_regex(&local_258);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&vStack_2d8);
  if ((pointer)local_310._32_8_ != (pointer)0x0) {
    operator_delete((void *)local_310._32_8_,local_310._48_8_ - local_310._32_8_);
  }
  if ((undefined1 *)local_310._0_8_ != local_310 + 0x10) {
    operator_delete((void *)local_310._0_8_,CONCAT71(local_310._17_7_,local_310[0x10]) + 1);
  }
LAB_0028b2bc:
  std::ifstream::~ifstream(local_238);
  return;
}

Assistant:

void compiler_type::import_csym(const std::string &module_path, const std::string &csym_path)
	{
		std::ifstream ifs(csym_path);
		if (!ifs.is_open())
			return;
		csym_info csym;
		std::regex reg("^#\\$cSYM/1\\.0\\(([^\\)]*)\\):(.*)$");
		// Read file
		std::string header, buff;
		bool expect_n = false;
		for (int ch = ifs.get(); ifs; ch = ifs.get()) {
			if (expect_n) {
				expect_n = false;
				if (ch != '\n')
					buff += '\r';
			}
			switch (ch) {
			case '\n':
				if (!header.empty()) {
					csym.codes.emplace_back(buff);
					buff.clear();
				}
				else
					std::swap(header, buff);
				break;
			case '\r':
				expect_n = true;
				break;
			default:
				buff += ch;
				break;
			}
		}
		if (!buff.empty()) {
			csym.codes.emplace_back(buff);
		}
		// Parsing header
		std::smatch match;
		if (!std::regex_match(header, match, reg))
			return;
		csym.file = match.str(1);
		std::string map_str = match.str(2);
		for (auto &ch: map_str) {
			if (ch == ',') {
				if (!buff.empty()) {
					if (buff != "-")
						csym.map.push_back(std::stoull(buff) + 1);
					else
						csym.map.push_back(0);
					buff.clear();
				}
			}
			else
				buff += ch;
		}
		if (!buff.empty()) {
			if (buff != "-")
				csym.map.push_back(std::stoull(buff) + 1);
			else
				csym.map.push_back(0);
			buff.clear();
		}
		csyms.emplace(module_path, std::move(csym));
	}